

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::Assign::Assign(Assign *this,Token *t,int line)

{
  Token local_50;
  int local_1c;
  Token *pTStack_18;
  int line_local;
  Token *t_local;
  Assign *this_local;
  
  local_1c = line;
  pTStack_18 = t;
  t_local = (Token *)this;
  token::Token::Token(&local_50,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&local_50,2,0,local_1c,AssignStmtType);
  token::Token::~Token(&local_50);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__Assign_001e0f58;
  return;
}

Assistant:

Assign(Token t, int line)
        :BinaryOp(t, PRECENDENCE::ADD, ASSOCIATION::LEFT,line, NodeType::AssignStmtType){}